

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPFakeTransmitter::ClearIgnoreList(RTPFakeTransmitter *this)

{
  if (((this->init == true) && (this->created == true)) && (this->receivemode == IgnoreSome)) {
    ClearAcceptIgnoreInfo(this);
    return;
  }
  return;
}

Assistant:

void RTPFakeTransmitter::ClearIgnoreList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::IgnoreSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}